

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrs.c
# Opt level: O0

void sgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  float *pfVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float *Mxvec;
  float *addr;
  long lVar16;
  long lVar17;
  int local_2d0;
  char local_2c8 [8];
  char msg_1 [256];
  char msg [256];
  int ii;
  flops_t solve_ops;
  float *soln;
  float *rhs_work;
  float *work;
  int nrhs;
  int ldb;
  int n;
  int jcol;
  int_t iptr;
  int_t istart;
  int_t luptr;
  int_t k;
  int_t j;
  int_t i;
  int irow;
  int nsupc;
  int nsupr;
  int nrow;
  int fsupc;
  float *Uval;
  float *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  float *Bmat;
  DNformat *Bstore;
  SuperMatrix *B_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  trans_t trans_local;
  
  *info = 0;
  piVar7 = (int *)B->Store;
  iVar1 = *piVar7;
  iVar2 = B->ncol;
  if (((trans == NOTRANS) || (trans == TRANS)) || (trans == CONJ)) {
    if (((L->nrow == L->ncol) && (-1 < L->nrow)) &&
       ((L->Stype == SLU_SC && ((L->Dtype == SLU_S && (L->Mtype == SLU_TRLU)))))) {
      if ((((U->nrow == U->ncol) && (-1 < U->nrow)) && (U->Stype == SLU_NC)) &&
         ((U->Dtype == SLU_S && (U->Mtype == SLU_TRU)))) {
        if (L->nrow < 0) {
          local_2d0 = 0;
        }
        else {
          local_2d0 = L->nrow;
        }
        if (((iVar1 < local_2d0) || (B->Stype != SLU_DN)) ||
           ((B->Dtype != SLU_S || (B->Mtype != SLU_GE)))) {
          *info = -6;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    iVar3 = L->nrow;
    Mxvec = floatCalloc((long)iVar3 * (long)iVar2);
    if (Mxvec == (float *)0x0) {
      sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
      superlu_abort_and_exit(msg_1 + 0xf8);
    }
    addr = floatMalloc((long)iVar3);
    if (addr == (float *)0x0) {
      sprintf(local_2c8,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
      superlu_abort_and_exit(local_2c8);
    }
    pfVar8 = *(float **)(piVar7 + 2);
    pvVar9 = L->Store;
    lVar10 = *(long *)((long)pvVar9 + 8);
    pvVar11 = U->Store;
    lVar12 = *(long *)((long)pvVar11 + 8);
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    if (trans == NOTRANS) {
      for (k = 0; k < iVar2; k = k + 1) {
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          addr[perm_r[istart]] = pfVar8[(long)k * (long)iVar1 + (long)istart];
        }
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          pfVar8[(long)k * (long)iVar1 + (long)istart] = addr[istart];
        }
      }
      for (istart = 0; istart <= *(int *)((long)pvVar9 + 4); istart = istart + 1) {
        iVar4 = *(int *)(*(long *)((long)pvVar9 + 0x30) + (long)istart * 4);
        iVar5 = *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)iVar4 * 4);
        iVar13 = *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)(iVar4 + 1) * 4) - iVar5;
        iVar14 = *(int *)(*(long *)((long)pvVar9 + 0x30) + (long)(istart + 1) * 4) - iVar4;
        iVar15 = iVar13 - iVar14;
        msg._252_4_ = (float)(iVar15 * 2 * iVar14 * iVar2) +
                      (float)(iVar14 * (iVar14 + -1) * iVar2) + (float)msg._252_4_;
        if (iVar14 == 1) {
          for (luptr = 0; luptr < iVar2; luptr = luptr + 1) {
            lVar16 = (long)luptr * (long)iVar1;
            iptr = *(int_t *)(*(long *)((long)pvVar9 + 0x10) + (long)iVar4 * 4);
            n = iVar5;
            while (n = n + 1, n < *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)(iVar4 + 1) * 4))
            {
              iptr = iptr + 1;
              lVar17 = (long)*(int *)(*(long *)((long)pvVar9 + 0x18) + (long)n * 4);
              pfVar8[lVar16 + lVar17] =
                   -pfVar8[lVar16 + iVar4] * *(float *)(lVar10 + (long)iptr * 4) +
                   pfVar8[lVar16 + lVar17];
            }
          }
        }
        else {
          iVar6 = *(int *)(*(long *)((long)pvVar9 + 0x10) + (long)iVar4 * 4);
          for (luptr = 0; luptr < iVar2; luptr = luptr + 1) {
            lVar16 = (long)luptr * (long)iVar1;
            slsolve(iVar13,iVar14,(float *)(lVar10 + (long)iVar6 * 4),pfVar8 + lVar16 + iVar4);
            smatvec(iVar13,iVar15,iVar14,(float *)(lVar10 + (long)(iVar6 + iVar14) * 4),
                    pfVar8 + lVar16 + iVar4,Mxvec);
            n = iVar5 + iVar14;
            for (k = 0; k < iVar15; k = k + 1) {
              lVar17 = (long)*(int *)(*(long *)((long)pvVar9 + 0x18) + (long)n * 4);
              pfVar8[lVar16 + lVar17] = pfVar8[lVar16 + lVar17] - Mxvec[k];
              Mxvec[k] = 0.0;
              n = n + 1;
            }
          }
        }
      }
      for (istart = *(int_t *)((long)pvVar9 + 4); -1 < istart; istart = istart + -1) {
        iVar4 = *(int *)(*(long *)((long)pvVar9 + 0x30) + (long)istart * 4);
        iVar5 = *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)iVar4 * 4);
        iVar13 = *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)(iVar4 + 1) * 4);
        iVar15 = *(int *)(*(long *)((long)pvVar9 + 0x30) + (long)(istart + 1) * 4) - iVar4;
        iVar14 = *(int *)(*(long *)((long)pvVar9 + 0x10) + (long)iVar4 * 4);
        msg._252_4_ = (float)(iVar15 * (iVar15 + 1) * iVar2) + (float)msg._252_4_;
        if (iVar15 == 1) {
          soln = pfVar8;
          for (luptr = 0; luptr < iVar2; luptr = luptr + 1) {
            soln[iVar4] = soln[iVar4] / *(float *)(lVar10 + (long)iVar14 * 4);
            soln = soln + iVar1;
          }
        }
        else {
          for (luptr = 0; luptr < iVar2; luptr = luptr + 1) {
            susolve(iVar13 - iVar5,iVar15,(float *)(lVar10 + (long)iVar14 * 4),
                    pfVar8 + (long)iVar4 + (long)luptr * (long)iVar1);
          }
        }
        for (luptr = 0; luptr < iVar2; luptr = luptr + 1) {
          lVar16 = (long)luptr * (long)iVar1;
          for (ldb = iVar4; ldb < iVar4 + iVar15; ldb = ldb + 1) {
            msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar11 + 0x18) + (long)(ldb + 1) * 4) -
                                  *(int *)(*(long *)((long)pvVar11 + 0x18) + (long)ldb * 4)) * 2) +
                          (float)msg._252_4_;
            for (k = *(int_t *)(*(long *)((long)pvVar11 + 0x18) + (long)ldb * 4);
                k < *(int *)(*(long *)((long)pvVar11 + 0x18) + (long)(ldb + 1) * 4); k = k + 1) {
              lVar17 = (long)*(int *)(*(long *)((long)pvVar11 + 0x10) + (long)k * 4);
              pfVar8[lVar16 + lVar17] =
                   -pfVar8[lVar16 + ldb] * *(float *)(lVar12 + (long)k * 4) +
                   pfVar8[lVar16 + lVar17];
            }
          }
        }
      }
      for (k = 0; k < iVar2; k = k + 1) {
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          addr[istart] = pfVar8[(long)k * (long)iVar1 + (long)perm_c[istart]];
        }
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          pfVar8[(long)k * (long)iVar1 + (long)istart] = addr[istart];
        }
      }
      stat->ops[0x11] = (flops_t)msg._252_4_;
    }
    else {
      for (k = 0; k < iVar2; k = k + 1) {
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          addr[perm_c[istart]] = pfVar8[(long)k * (long)iVar1 + (long)istart];
        }
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          pfVar8[(long)k * (long)iVar1 + (long)istart] = addr[istart];
        }
      }
      stat->ops[0x11] = 0.0;
      for (istart = 0; istart < iVar2; istart = istart + 1) {
        sp_strsv("U","T","N",L,U,pfVar8 + (long)istart * (long)iVar1,stat,info);
        sp_strsv("L","T","U",L,U,pfVar8 + (long)istart * (long)iVar1,stat,info);
      }
      for (k = 0; k < iVar2; k = k + 1) {
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          addr[istart] = pfVar8[(long)k * (long)iVar1 + (long)perm_r[istart]];
        }
        for (istart = 0; istart < iVar3; istart = istart + 1) {
          pfVar8[(long)k * (long)iVar1 + (long)istart] = addr[istart];
        }
      }
    }
    superlu_free(Mxvec);
    superlu_free(addr);
  }
  else {
    msg._248_4_ = -*info;
    input_error("sgstrs",(int *)(msg + 0xf8));
  }
  return;
}

Assistant:

void
sgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    float   alpha = 1.0, beta = 1.0;
    float   *work_col;
#endif
    DNformat *Bstore;
    float   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    float   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void sprint_soln(int n, int nrhs, const float *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_S || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_S || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_S || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("sgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = floatCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = floatMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		strsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		sgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    slsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    smatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		strsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    susolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_strsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_strsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}